

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void assignStringSymbol(Symbol *sym,char *value)

{
  char *pcVar1;
  int *piVar2;
  size_t sVar3;
  char *string;
  char *value_local;
  Symbol *sym_local;
  
  pcVar1 = strdup(value);
  if (pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    pcVar1 = strerror(*piVar2);
    fatalerror("No memory for string equate: %s\n",pcVar1);
  }
  sym->type = SYM_EQUS;
  (sym->field_8).field_2.macro = pcVar1;
  sVar3 = strlen(pcVar1);
  (sym->field_8).field_2.macroSize = sVar3;
  return;
}

Assistant:

static void assignStringSymbol(struct Symbol *sym, char const *value)
{
	char *string = strdup(value);

	if (!string)
		fatalerror("No memory for string equate: %s\n", strerror(errno));

	sym->type = SYM_EQUS;
	sym->macro = string;
	sym->macroSize = strlen(string);
}